

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::status_internal::StatusRep::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StatusRep *this,StatusToStringMode mode)

{
  StatusCode SVar1;
  StatusToStringMode SVar2;
  string *str;
  StatusCode code;
  anon_class_16_2_39a01b4a local_110;
  FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
  local_100;
  StatusPayloadPrinter local_f0;
  StatusPayloadPrinter printer;
  undefined1 local_e0 [7];
  bool with_payload;
  AlphaNum local_b0;
  string local_70;
  AlphaNum local_50;
  undefined1 local_1d;
  StatusToStringMode local_1c;
  StatusRep *pSStack_18;
  StatusToStringMode mode_local;
  StatusRep *this_local;
  string *text;
  
  local_1d = 0;
  local_1c = mode;
  pSStack_18 = this;
  this_local = (StatusRep *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  SVar1 = StatusRep::code(this);
  StatusCodeToString_abi_cxx11_(&local_70,(lts_20250127 *)(ulong)SVar1,code);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
  AlphaNum::AlphaNum(&local_b0,": ");
  str = message_abi_cxx11_(this);
  AlphaNum::AlphaNum<std::allocator<char>>((AlphaNum *)local_e0,str);
  StrAppend(__return_storage_ptr__,&local_50,&local_b0,(AlphaNum *)local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  SVar2 = operator&(local_1c,kDefault);
  printer._7_1_ = SVar2 == kDefault;
  if ((bool)printer._7_1_) {
    local_f0 = GetStatusPayloadPrinter_abi_cxx11_();
    local_110.printer = &local_f0;
    local_110.text = __return_storage_ptr__;
    FunctionRef<void(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&)>
    ::
    FunctionRef<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0,void>
              ((FunctionRef<void(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&)>
                *)&local_100,&local_110);
    ForEachPayload(this,local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StatusRep::ToString(StatusToStringMode mode) const {
  std::string text;
  absl::StrAppend(&text, absl::StatusCodeToString(code()), ": ", message());

  const bool with_payload = (mode & StatusToStringMode::kWithPayload) ==
                            StatusToStringMode::kWithPayload;

  if (with_payload) {
    status_internal::StatusPayloadPrinter printer =
        status_internal::GetStatusPayloadPrinter();
    this->ForEachPayload([&](absl::string_view type_url,
                             const absl::Cord& payload) {
      absl::optional<std::string> result;
      if (printer) result = printer(type_url, payload);
      absl::StrAppend(
          &text, " [", type_url, "='",
          result.has_value() ? *result : absl::CHexEscape(std::string(payload)),
          "']");
    });
  }

  return text;
}